

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_Face(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *self;
  AActor *other;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  VMValue *pVVar4;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  TArray<VMValue,_VMValue> *pTVar6;
  char *pcVar7;
  bool bVar8;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = (AActor *)(param->field_0).field_1.a;
      pTVar6 = defaultparam;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
          uVar5 = extraout_RDX;
        }
        pPVar3 = (self->super_DThinker).super_DObject.Class;
        bVar8 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar8);
        uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar8);
        pTVar6 = (TArray<VMValue,_VMValue> *)
                 CONCAT71((int7)((ulong)pTVar6 >> 8),pPVar3 == pPVar1 || bVar8);
        if (pPVar3 != pPVar1 && !bVar8) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f49f8;
        }
      }
      pPVar1 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          other = (AActor *)param[1].field_0.field_1.a;
          if (other != (AActor *)0x0) {
            if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(other->super_DThinker).super_DObject._vptr_DObject)
                                (other,pTVar6,uVar5,ret);
              (other->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar2);
            }
            pPVar3 = (other->super_DThinker).super_DObject.Class;
            bVar8 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar1 && bVar8) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar8 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar8) {
              pcVar7 = "faceto == NULL || faceto->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_003f4a17;
            }
          }
          if (numparam < 3) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[2].field_0.field_3.Type != '\x01') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003f4a36;
            }
          }
          else {
            pVVar4 = param;
            if (param[2].field_0.field_3.Type != '\x01') {
              pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f4a36:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0xc20,
                            "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_38.Degrees = (double)pVVar4[2].field_0.field_1.a;
          if (numparam < 4) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[3].field_0.field_3.Type != '\x01') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003f4a55;
            }
          }
          else {
            pVVar4 = param;
            if (param[3].field_0.field_3.Type != '\x01') {
              pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f4a55:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0xc21,
                            "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_40.Degrees = (double)pVVar4[3].field_0.field_1.a;
          if (numparam < 5) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[4].field_0.field_3.Type != '\x01') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003f4a74;
            }
          }
          else {
            pVVar4 = param;
            if (param[4].field_0.field_3.Type != '\x01') {
              pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f4a74:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0xc22,
                            "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_48.Degrees = (double)pVVar4[4].field_0.field_1.a;
          if (numparam < 6) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[5].field_0.field_3.Type != '\x01') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003f4a93;
            }
          }
          else {
            pVVar4 = param;
            if (param[5].field_0.field_3.Type != '\x01') {
              pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f4a93:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0xc23,
                            "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_50.Degrees = (double)pVVar4[5].field_0.field_1.a;
          if (numparam < 7) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[6].field_0.field_3.Type != '\0') {
              pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003f4ab2;
            }
          }
          else {
            pVVar4 = param;
            if (param[6].field_0.field_3.Type != '\0') {
              pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003f4ab2:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0xc24,
                            "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 8) {
            param = defaultparam->Array;
            if (param[7].field_0.field_3.Type == '\x01') goto LAB_003f4983;
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          }
          else {
            if (param[7].field_0.field_3.Type == '\x01') {
LAB_003f4983:
              A_Face(self,other,&local_38,&local_40,&local_48,&local_50,pVVar4[6].field_0.i,
                     param[7].field_0.f);
              return 0;
            }
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc25,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003f4a17:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc1f,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f49f8:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc1e,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Face)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(faceto, AActor)
	PARAM_ANGLE_DEF(max_turn)		
	PARAM_ANGLE_DEF(max_pitch)		
	PARAM_ANGLE_DEF(ang_offset)		
	PARAM_ANGLE_DEF(pitch_offset)	
	PARAM_INT_DEF(flags)			
	PARAM_FLOAT_DEF(z_add)			

	A_Face(self, faceto, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}